

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

Location * __thiscall
c4::yml::Parser::location(Location *__return_storage_ptr__,Parser *this,ConstNodeRef node)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  Location *pLVar5;
  csubstr cVar6;
  char *pcStack_58;
  size_t local_50;
  char msg [29];
  
  if (node.m_tree == (Tree *)0x0 || node.m_id == 0xffffffffffffffff) {
    builtin_strncpy(msg + 0x10,"ode.valid())",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        pLVar5 = (Location *)(*pcVar2)();
        return pLVar5;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar6.len;
    pcStack_58 = cVar6.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f94) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f94) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x1d,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  location(__return_storage_ptr__,this,node.m_tree,node.m_id);
  return __return_storage_ptr__;
}

Assistant:

Location Parser::location(ConstNodeRef node) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, node.valid());
    return location(*node.tree(), node.id());
}